

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O1

void P_SerializePolyobjs(FArchive *arc)

{
  FArchive *pFVar1;
  int iVar2;
  FPolyObj *this;
  DAngle *ang;
  int data;
  int seg;
  DAngle angle;
  DWORD local_54;
  DVector2 local_50;
  DAngle local_40;
  DAngle local_38;
  
  if (arc->m_Storing == true) {
    local_50.X = (double)CONCAT44(local_50.X._4_4_,0x68);
    pFVar1 = FArchive::operator<<(arc,(DWORD *)&local_50);
    FArchive::operator<<(pFVar1,(DWORD *)&po_NumPolyobjs);
    if (0 < po_NumPolyobjs) {
      ang = &polyobjs->Angle;
      iVar2 = 0;
      do {
        pFVar1 = FArchive::operator<<(arc,(DWORD *)(ang + 1));
        pFVar1 = operator<<(pFVar1,ang);
        pFVar1 = operator<<(pFVar1,(DVector2 *)(ang + -10));
        pFVar1 = FArchive::SerializeObject
                           (pFVar1,(DObject **)(ang + 9),DInterpolation::RegistrationInfo.MyClass);
        pFVar1 = FArchive::operator<<(pFVar1,(bool *)((long)(ang + 4) + 5));
        FArchive::operator<<(pFVar1,(BYTE *)((long)(ang + 4) + 6));
        FArchive::SerializeObject(arc,(DObject **)(ang + 8),DPolyAction::RegistrationInfo.MyClass);
        iVar2 = iVar2 + 1;
        ang = ang + 0x1e;
      } while (iVar2 < po_NumPolyobjs);
    }
  }
  else {
    FArchive::operator<<(arc,&local_54);
    if (local_54 != 0x68) {
      I_Error("Polyobject marker missing");
    }
    FArchive::operator<<(arc,&local_54);
    if (local_54 != po_NumPolyobjs) {
      I_Error("UnarchivePolyobjs: Bad polyobj count");
    }
    if (0 < po_NumPolyobjs) {
      iVar2 = 0;
      this = polyobjs;
      do {
        FArchive::operator<<(arc,&local_54);
        if (local_54 != this->tag) {
          I_Error("UnarchivePolyobjs: Invalid polyobj tag");
        }
        pFVar1 = operator<<(arc,&local_38);
        pFVar1 = operator<<(pFVar1,&local_50);
        FArchive::SerializeObject
                  (pFVar1,(DObject **)&this->interpolation,DInterpolation::RegistrationInfo.MyClass)
        ;
        FArchive::operator<<(arc,&this->bBlocked);
        FArchive::operator<<(arc,&this->bHasPortals);
        if (0x11c3 < SaveVersion) {
          FArchive::SerializeObject
                    (arc,(DObject **)&this->specialdata,DPolyAction::RegistrationInfo.MyClass);
        }
        local_40.Degrees = local_38.Degrees;
        FPolyObj::RotatePolyobj(this,&local_40,true);
        local_50.X = local_50.X - (this->StartSpot).pos.X;
        local_50.Y = local_50.Y - (this->StartSpot).pos.Y;
        FPolyObj::MovePolyobj(this,&local_50,true);
        iVar2 = iVar2 + 1;
        this = this + 1;
      } while (iVar2 < po_NumPolyobjs);
    }
  }
  return;
}

Assistant:

void P_SerializePolyobjs (FArchive &arc)
{
	int i;
	FPolyObj *po;

	if (arc.IsStoring ())
	{
		int seg = ASEG_POLYOBJS;
		arc << seg << po_NumPolyobjs;
		for(i = 0, po = polyobjs; i < po_NumPolyobjs; i++, po++)
		{
			arc << po->tag << po->Angle << po->StartSpot.pos << po->interpolation << po->bBlocked << po->bHasPortals;
			arc << po->specialdata;
  		}
	}
	else
	{
		int data;
		DAngle angle;
		DVector2 delta;

		arc << data;
		if (data != ASEG_POLYOBJS)
			I_Error ("Polyobject marker missing");

		arc << data;
		if (data != po_NumPolyobjs)
		{
			I_Error ("UnarchivePolyobjs: Bad polyobj count");
		}
		for (i = 0, po = polyobjs; i < po_NumPolyobjs; i++, po++)
		{
			arc << data;
			if (data != po->tag)
			{
				I_Error ("UnarchivePolyobjs: Invalid polyobj tag");
			}
			arc << angle << delta << po->interpolation;
			arc << po->bBlocked;
			arc << po->bHasPortals;
			if (SaveVersion >= 4548)
			{
				arc << po->specialdata;
			}

			po->RotatePolyobj (angle, true);
			delta -= po->StartSpot.pos;
			po->MovePolyobj (delta, true);
		}
	}
}